

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputStream.cpp
# Opt level: O2

void __thiscall
supermap::io::FileOutputStream::FileOutputStream
          (FileOutputStream *this,string *filename,bool append)

{
  _Ios_Openmode _Var1;
  FileException *this_00;
  undefined7 in_register_00000011;
  allocator<char> local_49;
  string local_48;
  
  (this->super_OutputStream)._vptr_OutputStream = (_func_int **)&PTR_get_0010eaf8;
  std::__cxx11::string::string((string *)&this->filename_,(string *)filename);
  _Var1 = _S_out;
  if ((int)CONCAT71(in_register_00000011,append) != 0) {
    _Var1 = _S_app;
  }
  std::ofstream::ofstream(&this->ofs_,(string *)filename,_Var1);
  if (*(int *)(&this->field_0x48 + *(long *)(*(long *)&this->ofs_ + -0x18)) == 0) {
    return;
  }
  this_00 = (FileException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Unable to open for writing",&local_49);
  FileException::FileException(this_00,filename,&local_48);
  __cxa_throw(this_00,&FileException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

FileOutputStream::FileOutputStream(const std::string &filename, bool append)
    : filename_(filename), ofs_(filename, append ? std::ios_base::app : std::ios_base::out) {
    if (!ofs_.good() || ofs_.bad()) {
        throw FileException(filename, "Unable to open for writing");
    }
}